

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDASVtolerancesB(void *ida_mem,int which,sunrealtype relTolB,N_Vector absTolB)

{
  IDAadjMemRec *abstol;
  void *in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  void *ida_memB;
  IDABMem IDAB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMemRec *local_40;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x412,"IDASVtolerancesB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,-0x65,0x41b,"IDASVtolerancesB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"Illegal attempt to call before calling IDAadjInit.");
    local_4 = -0x65;
  }
  else {
    abstol = in_RDI->ida_adj_mem;
    if (in_ESI < abstol->ia_nbckpbs) {
      for (local_40 = abstol->IDAB_mem;
          (local_40 != (IDABMemRec *)0x0 && (in_ESI != local_40->ida_index));
          local_40 = local_40->ida_next) {
      }
      local_4 = IDASVtolerances(in_RDX,(sunrealtype)in_RDI,(N_Vector)abstol);
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x424,"IDASVtolerancesB",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"Illegal value for which.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDASVtolerancesB(void* ida_mem, int which, sunrealtype relTolB,
                     N_Vector absTolB)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  void* ida_memB;

  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return IDA_MEM_NULL;
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_WHICH);
    return (IDA_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }

  /* Get the IDAMem corresponding to this backward problem. */
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* Set tolerances and return. */
  return IDASVtolerances(ida_memB, relTolB, absTolB);
}